

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_mload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  MOB_INDEX_DATA *pMVar2;
  CHAR_DATA *pCVar3;
  char buf [4608];
  CHAR_DATA *victim;
  MOB_INDEX_DATA *pMobIndex;
  char arg [4608];
  char *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd8;
  int in_stack_ffffffffffffdbdc;
  CHAR_DATA *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbf8;
  CHAR_DATA *in_stack_ffffffffffffdc00;
  GEN_DATA *in_stack_ffffffffffffdca0;
  char local_1218 [52];
  int in_stack_ffffffffffffee1c;
  long in_stack_ffffffffffffee20;
  long in_stack_ffffffffffffee28;
  OBJ_DATA *in_stack_ffffffffffffee30;
  CHAR_DATA *in_stack_ffffffffffffee38;
  char *in_stack_ffffffffffffee40;
  
  one_argument(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  if ((local_1218[0] == '\0') || (bVar1 = is_number(in_stack_ffffffffffffdbc8), !bVar1)) {
    send_to_char((char *)in_stack_ffffffffffffdbe0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  }
  else {
    atoi(local_1218);
    pMVar2 = get_mob_index(in_stack_ffffffffffffdbdc);
    if (pMVar2 == (MOB_INDEX_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
    }
    else {
      pCVar3 = create_mobile((MOB_INDEX_DATA *)in_stack_ffffffffffffdca0);
      char_to_room(in_stack_ffffffffffffdc00,(ROOM_INDEX_DATA *)in_stack_ffffffffffffdbf8);
      act((char *)in_stack_ffffffffffffdbe0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
          in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8,0);
      sprintf(&stack0xffffffffffffdbd8,"$N loads %s.",pCVar3->short_descr);
      get_trust((CHAR_DATA *)&stack0xffffffffffffdbd8);
      wiznet(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
             in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
      send_to_char((char *)in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
    }
  }
  return;
}

Assistant:

void do_mload(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	MOB_INDEX_DATA *pMobIndex;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0' || !is_number(arg))
	{
		send_to_char("Syntax: load mob <vnum>.\n\r", ch);
		return;
	}

	pMobIndex = get_mob_index(atoi(arg));

	if (pMobIndex == nullptr)
	{
		send_to_char("No mob has that vnum.\n\r", ch);
		return;
	}

	victim = create_mobile(pMobIndex);

	char_to_room(victim, ch->in_room);

	act("$n has created $N!", ch, nullptr, victim, ch->invis_level > 50 ? TO_IMMINROOM : TO_ROOM);

	sprintf(buf, "$N loads %s.", victim->short_descr);
	wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}